

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall Character::Dress(Character *this,EquipLocation loc,unsigned_short gfx_id)

{
  Map *pMVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  uint uVar5;
  undefined6 in_register_00000012;
  PacketBuilder builder;
  PacketBuilder PStack_58;
  
  uVar5 = (uint)CONCAT62(in_register_00000012,gfx_id);
  (this->cosmetic_paperdoll)._M_elems[loc] = (-(uint)(uVar5 == 0) | uVar5) & 0xffff;
  PacketBuilder::PacketBuilder(&PStack_58,PACKET_AVATAR,PACKET_AGREE,0xe);
  PacketBuilder::AddShort(&PStack_58,this->player->id);
  PacketBuilder::AddChar(&PStack_58,1);
  PacketBuilder::AddChar(&PStack_58,0);
  AddPaperdollData(this,&PStack_58,"BAHWS");
  pMVar1 = this->map;
  for (p_Var2 = (pMVar1->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&pMVar1->characters; p_Var2 = p_Var2->_M_next) {
    if (((this->nowhere == false) &&
        (p_Var3 = p_Var2[1]._M_next, *(char *)((long)&p_Var3->_M_prev + 5) == '\0')) &&
       (bVar4 = InRange(this,*(uchar *)&p_Var3[0xc]._M_next,*(uchar *)((long)(p_Var3 + 0xc) + 1)),
       bVar4)) {
      Player::Send(*(Player **)((long)(p_Var3 + 0x41) + 8),&PStack_58);
    }
  }
  PacketBuilder::~PacketBuilder(&PStack_58);
  return;
}

Assistant:

void Character::Dress(EquipLocation loc, unsigned short gfx_id)
{
	if (gfx_id == 0)
		gfx_id = 65535;

	this->cosmetic_paperdoll[loc] = gfx_id;

	PacketBuilder builder(PACKET_AVATAR, PACKET_AGREE, 14);
	builder.AddShort(this->PlayerID());
	builder.AddChar(SLOT_CLOTHES);
	builder.AddChar(0); // sound
	this->AddPaperdollData(builder, "BAHWS");

	UTIL_FOREACH(this->map->characters, updatecharacter)
	{
		if (!this->InRange(updatecharacter))
			continue;

		updatecharacter->Send(builder);
	}
}